

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCanon.c
# Opt level: O2

uint Aig_RManSemiCanonicize
               (uint *pOut,uint *pIn,int nVars,char *pCanonPerm,Aig_VSig_t *pSigs,int fReturnIn)

{
  ushort *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  bool bVar15;
  uint *puVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  Aig_VSig_t *pAVar20;
  Aig_VSig_t *pAVar21;
  uint uVar22;
  bool bVar23;
  ulong uVar24;
  uint local_94;
  uint *local_88;
  Aig_VSig_t TempSig;
  
  Aig_RManComputeVSigs(pIn,nVars,pSigs,pOut);
  uVar19 = 0;
  uVar24 = 0;
  if (0 < nVars) {
    uVar24 = (ulong)(uint)nVars;
  }
  uVar22 = 0;
  pAVar21 = pSigs;
  for (; uVar24 != uVar19; uVar19 = uVar19 + 1) {
    pAVar20 = pAVar21 + 1;
    iVar17 = memcmp(pAVar21,pAVar20,4);
    if (0 < iVar17) {
      uVar22 = uVar22 | 1 << ((uint)uVar19 & 0x1f);
      iVar17 = pAVar21->nCofOnes[0xb];
      iVar12 = pAVar21->nOnes;
      iVar13 = pAVar21->nCofOnes[0];
      uVar2 = *(undefined8 *)(pAVar21->nCofOnes + 1);
      uVar3 = *(undefined8 *)(pAVar21->nCofOnes + 3);
      uVar4 = *(undefined8 *)(pAVar21->nCofOnes + 5);
      uVar5 = *(undefined8 *)(pAVar21->nCofOnes + 7);
      uVar6 = *(undefined8 *)(pAVar21->nCofOnes + 9);
      pAVar21->nCofOnes[0xb] = pAVar21[1].nCofOnes[0xb];
      iVar18 = pAVar20->nOnes;
      iVar11 = pAVar20->nCofOnes[0];
      uVar7 = *(undefined8 *)(pAVar21[1].nCofOnes + 1);
      uVar8 = *(undefined8 *)(pAVar21[1].nCofOnes + 3);
      uVar9 = *(undefined8 *)(pAVar21[1].nCofOnes + 5);
      uVar10 = *(undefined8 *)(pAVar21[1].nCofOnes + 9);
      *(undefined8 *)(pAVar21->nCofOnes + 7) = *(undefined8 *)(pAVar21[1].nCofOnes + 7);
      *(undefined8 *)(pAVar21->nCofOnes + 9) = uVar10;
      *(undefined8 *)(pAVar21->nCofOnes + 3) = uVar8;
      *(undefined8 *)(pAVar21->nCofOnes + 5) = uVar9;
      pAVar21->nOnes = iVar18;
      pAVar21->nCofOnes[0] = iVar11;
      *(undefined8 *)(pAVar21->nCofOnes + 1) = uVar7;
      pAVar21[1].nCofOnes[0xb] = iVar17;
      *(undefined8 *)(pAVar21[1].nCofOnes + 7) = uVar5;
      *(undefined8 *)(pAVar21[1].nCofOnes + 9) = uVar6;
      *(undefined8 *)(pAVar21[1].nCofOnes + 3) = uVar3;
      *(undefined8 *)(pAVar21[1].nCofOnes + 5) = uVar4;
      pAVar20->nOnes = iVar12;
      pAVar20->nCofOnes[0] = iVar13;
      *(undefined8 *)(pAVar21[1].nCofOnes + 1) = uVar2;
      Kit_TruthChangePhase(pIn,nVars,(uint)uVar19);
    }
    pAVar21 = pAVar21 + 2;
  }
  iVar17 = 1;
  if (1 < nVars) {
    iVar17 = nVars;
  }
  uVar19 = 0;
  local_94 = 0;
  bVar15 = true;
  puVar16 = pOut;
LAB_005199e2:
  do {
    local_88 = puVar16;
    bVar23 = bVar15;
    pAVar21 = pSigs + uVar19 * 2;
    do {
      uVar24 = uVar19;
      pAVar20 = pAVar21;
      if (iVar17 - 1 == uVar24) {
        uVar19 = 0;
        bVar15 = true;
        puVar16 = local_88;
        if (bVar23) {
          if ((local_94 & 1 ^ fReturnIn) != 1) {
            uVar19 = (ulong)(uint)(1 << ((char)nVars - 5U & 0x1f));
            if (nVars < 6) {
              uVar19 = 1;
            }
            for (; 0 < (int)uVar19; uVar19 = uVar19 - 1) {
              local_88[uVar19 - 1] = pIn[uVar19 - 1];
            }
          }
          return uVar22;
        }
        goto LAB_005199e2;
      }
      uVar19 = uVar24 + 1;
      pAVar21 = pAVar20 + 2;
      iVar18 = memcmp(pAVar20,pAVar21,4);
    } while (iVar18 < 1);
    puVar1 = (ushort *)(pCanonPerm + uVar24);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    local_94 = local_94 + 1;
    iVar18 = pAVar20->nCofOnes[0xb];
    iVar13 = pAVar20->nOnes;
    iVar14 = pAVar20->nCofOnes[0];
    uVar2 = *(undefined8 *)(pAVar20->nCofOnes + 1);
    uVar3 = *(undefined8 *)(pAVar20->nCofOnes + 3);
    uVar4 = *(undefined8 *)(pAVar20->nCofOnes + 5);
    uVar5 = *(undefined8 *)(pAVar20->nCofOnes + 7);
    uVar6 = *(undefined8 *)(pAVar20->nCofOnes + 9);
    pAVar20->nCofOnes[0xb] = pAVar20[2].nCofOnes[0xb];
    iVar11 = pAVar21->nOnes;
    iVar12 = pAVar21->nCofOnes[0];
    uVar7 = *(undefined8 *)(pAVar20[2].nCofOnes + 1);
    uVar8 = *(undefined8 *)(pAVar20[2].nCofOnes + 3);
    uVar9 = *(undefined8 *)(pAVar20[2].nCofOnes + 5);
    uVar10 = *(undefined8 *)(pAVar20[2].nCofOnes + 9);
    *(undefined8 *)(pAVar20->nCofOnes + 7) = *(undefined8 *)(pAVar20[2].nCofOnes + 7);
    *(undefined8 *)(pAVar20->nCofOnes + 9) = uVar10;
    *(undefined8 *)(pAVar20->nCofOnes + 3) = uVar8;
    *(undefined8 *)(pAVar20->nCofOnes + 5) = uVar9;
    pAVar20->nOnes = iVar11;
    pAVar20->nCofOnes[0] = iVar12;
    *(undefined8 *)(pAVar20->nCofOnes + 1) = uVar7;
    pAVar20[2].nCofOnes[0xb] = iVar18;
    *(undefined8 *)(pAVar20[2].nCofOnes + 7) = uVar5;
    *(undefined8 *)(pAVar20[2].nCofOnes + 9) = uVar6;
    *(undefined8 *)(pAVar20[2].nCofOnes + 3) = uVar3;
    *(undefined8 *)(pAVar20[2].nCofOnes + 5) = uVar4;
    pAVar21->nOnes = iVar13;
    pAVar21->nCofOnes[0] = iVar14;
    *(undefined8 *)(pAVar20[2].nCofOnes + 1) = uVar2;
    iVar18 = pAVar20[1].nCofOnes[0xb];
    iVar13 = pAVar20[1].nOnes;
    iVar14 = pAVar20[1].nCofOnes[0];
    uVar2 = *(undefined8 *)(pAVar20[1].nCofOnes + 1);
    uVar3 = *(undefined8 *)(pAVar20[1].nCofOnes + 3);
    uVar4 = *(undefined8 *)(pAVar20[1].nCofOnes + 5);
    uVar5 = *(undefined8 *)(pAVar20[1].nCofOnes + 7);
    uVar6 = *(undefined8 *)(pAVar20[1].nCofOnes + 9);
    pAVar20[1].nCofOnes[0xb] = pAVar20[3].nCofOnes[0xb];
    iVar11 = pAVar20[3].nOnes;
    iVar12 = pAVar20[3].nCofOnes[0];
    uVar7 = *(undefined8 *)(pAVar20[3].nCofOnes + 1);
    uVar8 = *(undefined8 *)(pAVar20[3].nCofOnes + 3);
    uVar9 = *(undefined8 *)(pAVar20[3].nCofOnes + 5);
    uVar10 = *(undefined8 *)(pAVar20[3].nCofOnes + 9);
    *(undefined8 *)(pAVar20[1].nCofOnes + 7) = *(undefined8 *)(pAVar20[3].nCofOnes + 7);
    *(undefined8 *)(pAVar20[1].nCofOnes + 9) = uVar10;
    *(undefined8 *)(pAVar20[1].nCofOnes + 3) = uVar8;
    *(undefined8 *)(pAVar20[1].nCofOnes + 5) = uVar9;
    pAVar20[1].nOnes = iVar11;
    pAVar20[1].nCofOnes[0] = iVar12;
    *(undefined8 *)(pAVar20[1].nCofOnes + 1) = uVar7;
    pAVar20[3].nCofOnes[0xb] = iVar18;
    *(undefined8 *)(pAVar20[3].nCofOnes + 7) = uVar5;
    *(undefined8 *)(pAVar20[3].nCofOnes + 9) = uVar6;
    *(undefined8 *)(pAVar20[3].nCofOnes + 3) = uVar3;
    *(undefined8 *)(pAVar20[3].nCofOnes + 5) = uVar4;
    pAVar20[3].nOnes = iVar13;
    pAVar20[3].nCofOnes[0] = iVar14;
    *(undefined8 *)(pAVar20[3].nCofOnes + 1) = uVar2;
    Kit_TruthSwapAdjacentVars(local_88,pIn,nVars,(int)uVar24);
    bVar15 = false;
    puVar16 = pIn;
    pIn = local_88;
  } while( true );
}

Assistant:

unsigned Aig_RManSemiCanonicize( unsigned * pOut, unsigned * pIn, int nVars, char * pCanonPerm, Aig_VSig_t * pSigs, int fReturnIn )
{
    Aig_VSig_t TempSig;
    int i, Temp, fChange, Counter;
    unsigned * pTemp, uCanonPhase = 0;
    // collect signatures 
    Aig_RManComputeVSigs( pIn, nVars, pSigs, pOut );
    // canonicize phase
    for ( i = 0; i < nVars; i++ )
    {
//        if ( pStore[2*i+0] <= pStore[2*i+1] )
        if ( Aig_RManCompareSigs( &pSigs[2*i+0], &pSigs[2*i+1], nVars ) <= 0 )
            continue;
        uCanonPhase |= (1 << i);
        TempSig = pSigs[2*i+0];
        pSigs[2*i+0] = pSigs[2*i+1];
        pSigs[2*i+1] = TempSig;
        Kit_TruthChangePhase( pIn, nVars, i );
    }
    // permute
    Counter = 0;
    do {
        fChange = 0;
        for ( i = 0; i < nVars-1; i++ )
        {
//            if ( pStore[2*i] <= pStore[2*(i+1)] )
            if ( Aig_RManCompareSigs( &pSigs[2*i], &pSigs[2*(i+1)], nVars ) <= 0 )
                continue;
            Counter++;
            fChange = 1;

            Temp = pCanonPerm[i];
            pCanonPerm[i] = pCanonPerm[i+1];
            pCanonPerm[i+1] = Temp;

            TempSig = pSigs[2*i];
            pSigs[2*i] = pSigs[2*(i+1)];
            pSigs[2*(i+1)] = TempSig;

            TempSig = pSigs[2*i+1];
            pSigs[2*i+1] = pSigs[2*(i+1)+1];
            pSigs[2*(i+1)+1] = TempSig;

            Kit_TruthSwapAdjacentVars( pOut, pIn, nVars, i );
            pTemp = pIn; pIn = pOut; pOut = pTemp;
        }
    } while ( fChange );

    // swap if it was moved an even number of times
    if ( fReturnIn ^ !(Counter & 1) )
        Kit_TruthCopy( pOut, pIn, nVars );
    return uCanonPhase;
}